

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

int Abc_ZddPerm(Abc_ZddMan *p,int a,int Var)

{
  int b;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_ZddObj *pAVar5;
  int Bj;
  int Bi;
  int Aj;
  int Ai;
  int VarTop;
  int VarPerm;
  int r;
  int r1;
  int r0;
  Abc_ZddObj *A;
  int Var_local;
  int a_local;
  Abc_ZddMan *p_local;
  
  if (p->nVars <= Var) {
    __assert_fail("Var < p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                  ,0x223,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
  }
  if (a == 0) {
    p_local._4_4_ = 0;
  }
  else if (a == 1) {
    p_local._4_4_ = Abc_ZddIthVar(Var);
  }
  else {
    p_local._4_4_ = Abc_ZddCacheLookup(p,a,Var,5);
    if (p_local._4_4_ < 0) {
      pAVar5 = Abc_ZddNode(p,a);
      if (p->pV2TI[Var] < p->pV2TI[*(uint *)pAVar5 & 0x7fffffff]) {
        VarTop = Abc_ZddUniqueCreate(p,Var,a,0);
      }
      else if ((*(uint *)pAVar5 & 0x7fffffff) == Var) {
        iVar2 = Abc_ZddPerm(p,pAVar5->False,Var);
        VarTop = Abc_ZddUnion(p,iVar2,pAVar5->True);
      }
      else {
        iVar2 = p->pV2TI[*(uint *)pAVar5 & 0x7fffffff];
        iVar3 = p->pV2TJ[*(uint *)pAVar5 & 0x7fffffff];
        iVar4 = p->pV2TI[Var];
        b = p->pV2TJ[Var];
        if (((iVar3 <= iVar2) || (b <= iVar4)) || (iVar4 < iVar2)) {
          __assert_fail("Ai < Aj && Bi < Bj && Ai <= Bi",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                        ,0x235,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
        }
        Ai = Var;
        if (iVar3 == iVar4) {
          Aj = Abc_ZddVarIJ(p,iVar2,b);
        }
        else if (iVar3 == b) {
          Aj = Abc_ZddVarIJ(p,iVar2,iVar4);
        }
        else {
          if (iVar2 == iVar4) {
            iVar2 = Abc_MinInt(iVar3,b);
            iVar3 = Abc_MaxInt(iVar3,b);
            Ai = Abc_ZddVarIJ(p,iVar2,iVar3);
            uVar1 = *(uint *)pAVar5;
          }
          else {
            uVar1 = *(uint *)pAVar5;
          }
          Aj = uVar1 & 0x7fffffff;
        }
        if (p->pV2TI[Ai] <= p->pV2TI[Aj]) {
          __assert_fail("p->pV2TI[VarPerm] > p->pV2TI[VarTop]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                        ,0x242,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
        }
        iVar2 = Abc_ZddPerm(p,pAVar5->False,Var);
        iVar3 = Abc_ZddPerm(p,pAVar5->True,Ai);
        iVar4 = Abc_ZddObjVar(p,iVar3);
        if (iVar4 <= Aj) {
          __assert_fail("Abc_ZddObjVar(p, r1) > VarTop",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                        ,0x245,"int Abc_ZddPerm(Abc_ZddMan *, int, int)");
        }
        iVar4 = Abc_ZddObjVar(p,iVar2);
        if (Aj < iVar4) {
          VarTop = Abc_ZddUniqueCreate(p,Aj,iVar3,iVar2);
        }
        else {
          iVar3 = Abc_ZddUniqueCreate(p,Aj,iVar3,0);
          VarTop = Abc_ZddUnion(p,iVar2,iVar3);
        }
      }
      p_local._4_4_ = Abc_ZddCacheInsert(p,a,Var,5,VarTop);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_ZddPerm( Abc_ZddMan * p, int a, int Var )
{
    Abc_ZddObj * A; 
    int r0, r1, r;
    assert( Var < p->nVars );
    if ( a == 0 )  return 0;
    if ( a == 1 )  return Abc_ZddIthVar(Var);
    if ( (r = Abc_ZddCacheLookup(p, a, Var, ABC_ZDD_OPER_PERM)) >= 0 )
        return r;
    A = Abc_ZddNode( p, a );
    if ( p->pV2TI[A->Var] > p->pV2TI[Var] ) // Ai > Bi
        r = Abc_ZddUniqueCreate( p, Var, a, 0 );
    else if ( (int)A->Var == Var ) // Ai == Bi && Aj == Bj
        r0 = Abc_ZddPerm( p, A->False, Var ), 
        r  = Abc_ZddUnion( p, r0, A->True );
    else 
    {
        int VarPerm, VarTop;
        int Ai = p->pV2TI[A->Var];
        int Aj = p->pV2TJ[A->Var];
        int Bi = p->pV2TI[Var];
        int Bj = p->pV2TJ[Var];
        assert( Ai < Aj && Bi < Bj && Ai <= Bi );
        if ( Aj == Bi )
            VarPerm = Var,
            VarTop  = Abc_ZddVarIJ(p, Ai, Bj);
        else if ( Aj == Bj )
            VarPerm = Var,
            VarTop  = Abc_ZddVarIJ(p, Ai, Bi);
        else if ( Ai == Bi )
            VarPerm = Abc_ZddVarIJ(p, Abc_MinInt(Aj, Bj), Abc_MaxInt(Aj, Bj)),
            VarTop  = A->Var;
        else // no clash
            VarPerm = Var, 
            VarTop  = A->Var;
        assert( p->pV2TI[VarPerm] > p->pV2TI[VarTop] );
        r0 = Abc_ZddPerm( p, A->False, Var ); 
        r1 = Abc_ZddPerm( p, A->True, VarPerm );
        assert( Abc_ZddObjVar(p, r1) > VarTop );
        if ( Abc_ZddObjVar(p, r0) > VarTop )
            r = Abc_ZddUniqueCreate( p, VarTop, r1, r0 );
        else
            r1 = Abc_ZddUniqueCreate( p, VarTop, r1, 0 ),
            r = Abc_ZddUnion( p, r0, r1 );
    }
    return Abc_ZddCacheInsert( p, a, Var, ABC_ZDD_OPER_PERM, r );
}